

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

CURLcode glob_url(URLGlob **glob,char *url,curl_off_t *urlnum,FILE *error)

{
  size_t sVar1;
  long lVar2;
  FILE *pFVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  URLGlob *glob_00;
  long lVar10;
  char **ppcVar11;
  char *__dest;
  int *piVar12;
  anon_union_40_3_e2f18bb4_for_content *paVar13;
  undefined1 *puVar14;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  byte *pbVar18;
  anon_union_40_3_e2f18bb4_for_content *paVar19;
  byte *pbVar20;
  URLPattern *pUVar21;
  byte *pbVar22;
  CURLcode CVar23;
  CURLcode CVar24;
  bool bVar25;
  byte *local_2b8;
  char end_c;
  char max_c;
  char min_c;
  byte *local_2a0;
  long local_298;
  anon_union_40_3_e2f18bb4_for_content *local_290;
  int local_284;
  byte *local_280;
  byte *local_278;
  long local_270;
  FILE *local_268;
  long *local_260;
  byte *local_258;
  byte *local_250;
  URLPattern *local_248;
  URLGlob **local_240;
  char *endp;
  
  *glob = (URLGlob *)0x0;
  local_268 = error;
  local_260 = urlnum;
  local_258 = (byte *)url;
  sVar8 = strlen(url);
  pcVar9 = (char *)malloc(sVar8 + 1);
  if (pcVar9 != (char *)0x0) {
    *pcVar9 = '\0';
    local_2b8 = (byte *)0x1;
    local_240 = glob;
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 != (URLGlob *)0x0) {
      glob_00->urllen = sVar8;
      glob_00->glob_buffer = pcVar9;
      local_298 = 1;
      CVar23 = CURLE_OK;
      local_284 = 0;
      pbVar22 = local_258;
      do {
        if ((CVar23 != CURLE_OK) || (*pbVar22 == 0)) {
          if (CVar23 == CURLE_OK) {
            *local_260 = local_298;
            *local_240 = glob_00;
            return CURLE_OK;
          }
          goto LAB_0011c841;
        }
        pbVar18 = (byte *)glob_00->glob_buffer;
        sVar8 = 0;
LAB_0011beee:
        for (; bVar17 = *pbVar22, bVar17 == 0x5b; pbVar22 = pbVar22 + (long)pcVar9) {
          pcVar9 = strchr((char *)pbVar22,0x5d);
          if (((pcVar9 == (char *)0x0) ||
              (pcVar9 = pcVar9 + (1 - (long)pbVar22), (char *)0x7f < pcVar9)) ||
             (lVar10 = curl_url(), lVar10 == 0)) {
LAB_0011bf6d:
            pcVar9 = (char *)0x2;
            if (pbVar22[1] != 0x5d) goto LAB_0011c00a;
          }
          else {
            memcpy(&endp,pbVar22,(size_t)pcVar9);
            *(char *)((long)&endp + (long)pcVar9) = '\0';
            iVar6 = curl_url_set(lVar10,0,&endp,0x200);
            curl_url_cleanup(lVar10);
            if (iVar6 != 0) goto LAB_0011bf6d;
            if (pcVar9 == (char *)0x0) goto LAB_0011c00a;
          }
          memcpy(pbVar18,pbVar22,(size_t)pcVar9);
          pbVar18 = pbVar18 + (long)pcVar9;
          sVar8 = sVar8 + (long)pcVar9;
        }
        if (bVar17 != 0) {
          if (bVar17 != 0x5c) {
            if (bVar17 != 0x5d) {
              if (bVar17 == 0x7b) goto LAB_0011c00a;
              if (bVar17 != 0x7d) goto LAB_0011bff2;
            }
            pcVar9 = "unmatched close brace/bracket";
            goto LAB_0011c82a;
          }
          pbVar20 = pbVar22 + 1;
          bVar17 = 0x5c;
          uVar7 = *pbVar20 - 0x5b;
          if ((uVar7 < 0x23) && ((0x500000005U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) {
            pbVar22 = pbVar22 + 1;
            local_2b8 = local_2b8 + 1;
            bVar17 = *pbVar20;
          }
LAB_0011bff2:
          pbVar22 = pbVar22 + 1;
          *pbVar18 = bVar17;
          pbVar18 = pbVar18 + 1;
          local_2b8 = local_2b8 + 1;
          sVar8 = sVar8 + 1;
          goto LAB_0011beee;
        }
LAB_0011c00a:
        if (sVar8 == 0) {
          CVar23 = CURLE_OK;
          CVar24 = CURLE_OK;
          if (*pbVar22 == 0x5b) {
            pbVar18 = pbVar22 + 1;
            local_2b8 = local_2b8 + 1;
            pUVar21 = glob_00->pattern + glob_00->size;
            glob_00->pattern[glob_00->size].globindex = local_284;
            local_284 = local_284 + 1;
            if ((byte)((pbVar22[1] & 0xdf) + 0xbf) < 0x1a) {
              pUVar21->type = UPTCharRange;
              iVar6 = __isoc99_sscanf(pbVar18,"%c-%c%c",&min_c,&max_c);
              bVar25 = true;
              pbVar20 = pbVar18;
              bVar4 = true;
              if (iVar6 == 3) {
                if (end_c == ']') {
                  pbVar20 = pbVar22 + 5;
                  bVar4 = false;
                  goto LAB_0011c5c8;
                }
                uVar15 = 1;
                if (end_c == ':') {
                  piVar12 = __errno_location();
                  *piVar12 = 0;
                  uVar15 = strtoul((char *)(pbVar22 + 5),&endp,10);
                  if ((*piVar12 == 0) && (pbVar22 + 5 != (byte *)endp)) {
                    pbVar20 = (byte *)(endp + 1);
                    if (*endp != ']') {
                      uVar15 = 0;
                      pbVar20 = pbVar18;
                    }
                  }
                  else {
                    uVar15 = 0;
                  }
                  bVar25 = false;
                }
              }
              else {
LAB_0011c5c8:
                bVar25 = bVar4;
                uVar15 = 1;
              }
              local_2b8 = pbVar20 + ((long)local_2b8 - (long)pbVar18);
              if (((!bVar25) && (0xffffffff80000000 < uVar15 - 0x80000000)) &&
                 ((min_c != max_c || (uVar15 == 1)))) {
                if (min_c == max_c) {
                  uVar7 = (int)max_c - (int)min_c;
LAB_0011c64e:
                  (pUVar21->content).CharRange.step = (int)uVar15;
                  (pUVar21->content).CharRange.min_c = min_c;
                  (pUVar21->content).CharRange.ptr_c = min_c;
                  (pUVar21->content).CharRange.max_c = max_c;
                  iVar6 = (int)uVar7 / (int)uVar15;
                  pbVar22 = pbVar20;
                  CVar23 = CVar24;
                  if (iVar6 < 0) {
                    local_298 = 0;
                  }
                  else {
                    bVar25 = local_298 < 1;
                    local_298 = (ulong)(iVar6 + 1) * local_298;
                    if (bVar25) {
                      local_298 = 0;
                    }
                  }
                  goto LAB_0011c61b;
                }
                if (min_c <= max_c) {
                  uVar7 = (int)max_c - (int)min_c;
                  if (((int)uVar7 < 0x1a) && (uVar15 <= uVar7)) goto LAB_0011c64e;
                }
              }
              glob_00->error = "bad range";
              glob_00->pos = (size_t)local_2b8;
              pbVar22 = pbVar18;
            }
            else if ((byte)(pbVar22[1] - 0x30) < 10) {
              pUVar21->type = UPTNumRange;
              (pUVar21->content).Set.ptr_s = 0;
              if (*pbVar18 == 0x30) {
                lVar10 = 2;
                bVar17 = 0x30;
                while ((byte)(bVar17 - 0x30) < 10) {
                  (pUVar21->content).Set.ptr_s = (int)lVar10 + -1;
                  pbVar20 = pbVar22 + lVar10;
                  lVar10 = lVar10 + 1;
                  bVar17 = *pbVar20;
                }
              }
              piVar12 = __errno_location();
              *piVar12 = 0;
              paVar13 = (anon_union_40_3_e2f18bb4_for_content *)strtoul((char *)pbVar18,&endp,10);
              if ((*piVar12 == 0) && ((byte *)endp != pbVar18)) {
                pbVar22 = (byte *)endp;
                if (*endp == '-') {
                  do {
                    do {
                      pbVar22 = pbVar22 + 1;
                      bVar17 = *pbVar22;
                    } while (bVar17 == 0x20);
                  } while (bVar17 == 9);
                  if ((byte)(bVar17 - 0x30) < 10) {
                    *piVar12 = 0;
                    local_290 = paVar13;
                    puVar14 = (undefined1 *)strtoul((char *)pbVar22,&endp,10);
                    if (*piVar12 == 0) {
                      cVar5 = *endp;
                      if (cVar5 == ':') {
                        pbVar22 = (byte *)(endp + 1);
                        *piVar12 = 0;
                        uVar15 = strtoul((char *)pbVar22,&endp,10);
                        if ((*piVar12 != 0) || (endp == (char *)0x0)) {
                          bVar25 = false;
                          paVar13 = local_290;
                          goto LAB_0011c465;
                        }
                        cVar5 = *endp;
                      }
                      else {
                        uVar15 = 1;
                      }
                      paVar13 = local_290;
                      if (cVar5 == ']') {
                        bVar25 = true;
                        pbVar22 = (byte *)(endp + 1);
                      }
                      else {
                        bVar25 = false;
                      }
                    }
                    else {
                      bVar25 = false;
                      uVar15 = 0;
                      paVar13 = local_290;
                    }
                  }
                  else {
                    bVar25 = false;
                    puVar14 = (undefined1 *)0x0;
                    uVar15 = 0;
                  }
                }
                else {
                  bVar25 = false;
                  puVar14 = (undefined1 *)0x0;
                  uVar15 = 0;
                  pbVar22 = pbVar18;
                }
              }
              else {
                bVar25 = false;
                puVar14 = (undefined1 *)0x0;
                uVar15 = 0;
                pbVar22 = pbVar18;
              }
LAB_0011c465:
              local_2b8 = pbVar22 + ((long)local_2b8 - (long)pbVar18);
              if (((bVar25) && (uVar15 != 0)) &&
                 ((paVar13 != (anon_union_40_3_e2f18bb4_for_content *)puVar14 || (uVar15 == 1)))) {
                uVar16 = (long)puVar14 - (long)paVar13;
                if (uVar16 == 0) {
                  uVar16 = 0;
                }
                else if ((puVar14 < paVar13) || (uVar16 < uVar15)) goto LAB_0011c48d;
                (pUVar21->content).NumRange.min_n = (curl_off_t)paVar13;
                (pUVar21->content).NumRange.ptr_n = (curl_off_t)paVar13;
                (pUVar21->content).Set.size = (curl_off_t)puVar14;
                (pUVar21->content).NumRange.step = uVar15;
                if ((long)uVar16 / (long)uVar15 < 0) {
                  local_298 = 0;
                }
                else {
                  bVar25 = local_298 < 1;
                  local_298 = ((long)uVar16 / (long)uVar15 + 1) * local_298;
                  if (bVar25) {
                    local_298 = 0;
                  }
                }
                goto LAB_0011c098;
              }
LAB_0011c48d:
              glob_00->error = "bad range";
              glob_00->pos = (size_t)local_2b8;
              pbVar22 = pbVar18;
            }
            else {
              glob_00->error = "bad range specification";
LAB_0011c589:
              glob_00->pos = (size_t)local_2b8;
              pbVar22 = pbVar18;
            }
            CVar23 = CURLE_URL_MALFORMAT;
          }
          else if (*pbVar22 == 0x7b) {
            local_280 = pbVar22 + 1;
            local_278 = (byte *)glob_00->glob_buffer;
            sVar1 = glob_00->size;
            pUVar21 = glob_00->pattern + sVar1;
            glob_00->pattern[sVar1].type = UPTSet;
            paVar19 = &glob_00->pattern[sVar1].content;
            paVar13 = &glob_00->pattern[sVar1].content;
            (paVar13->Set).elements = (char **)0x0;
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar13->Set + 8))->min_c = '\0';
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar13->Set + 8))->max_c = '\0';
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar13->Set + 8))->ptr_c = '\0';
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar13->Set + 8))->field_0x3 = 0;
            ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar13->Set + 8))->step = 0;
            glob_00->pattern[sVar1].content.Set.ptr_s = 0;
            glob_00->pattern[sVar1].globindex = local_284;
            local_284 = local_284 + 1;
            local_270 = 1;
            local_250 = local_2b8;
            local_290 = paVar19;
            local_248 = pUVar21;
LAB_0011c125:
            local_2a0 = local_250 + 1;
            iVar6 = 1;
            lVar10 = local_270;
            do {
              bVar25 = iVar6 == 0;
              iVar6 = iVar6 + -1;
              if (bVar25) {
                pbVar22 = local_280 + local_270;
                local_2b8 = local_2a0;
                break;
              }
              bVar17 = pbVar22[lVar10];
              if (bVar17 != 0x2c) {
                if (bVar17 != 0x7d) {
                  if ((bVar17 == 0x7b) || (bVar17 == 0x5b)) {
                    pcVar9 = "nested brace";
LAB_0011c57d:
                    glob_00->error = pcVar9;
                    pbVar18 = local_280;
                    local_2b8 = local_2a0;
                    goto LAB_0011c589;
                  }
                  if (bVar17 == 0x5c) {
                    bVar17 = pbVar22[lVar10 + 1];
                    if (bVar17 == 0) {
                      bVar17 = 0x5c;
                    }
                    else {
                      lVar10 = lVar10 + 1;
                      local_2a0 = local_250 + 2;
                    }
                  }
                  else {
                    if (bVar17 == 0x5d) {
                      pcVar9 = "unexpected close bracket";
                      goto LAB_0011c57d;
                    }
                    if (bVar17 == 0) {
                      glob_00->error = "unmatched brace";
                      glob_00->pos = (size_t)local_2b8;
                      CVar23 = CURLE_URL_MALFORMAT;
                      pbVar22 = local_280;
                      local_2b8 = local_2a0;
                      break;
                    }
                  }
                  *local_278 = bVar17;
                  local_278 = local_278 + 1;
                  goto LAB_0011c295;
                }
                if (lVar10 == 1) {
                  glob_00->error = "empty string within braces";
                  glob_00->pos = (size_t)local_2a0;
                  pbVar22 = local_280;
                  local_2b8 = local_2a0;
                  CVar23 = CURLE_URL_MALFORMAT;
                  break;
                }
                lVar2 = (pUVar21->content).Set.size;
                if (lVar2 < 0) {
                  local_298 = 0;
                }
                else {
                  bVar25 = local_298 < 1;
                  local_298 = (lVar2 + 1) * local_298;
                  if (bVar25) {
                    local_298 = 0;
                  }
                }
              }
              *local_278 = 0;
              if ((paVar19->Set).elements == (char **)0x0) {
                ppcVar11 = (char **)malloc(8);
                (paVar19->Set).elements = ppcVar11;
                if (ppcVar11 != (char **)0x0) goto LAB_0011c1df;
LAB_0011c3e3:
                glob_00->error = "out of memory";
                glob_00->pos = 0;
                CVar23 = CURLE_OUT_OF_MEMORY;
                pbVar22 = local_280;
                local_2b8 = local_2a0;
                break;
              }
              ppcVar11 = (char **)realloc((paVar19->Set).elements,
                                          (pUVar21->content).Set.size * 8 + 8);
              if (ppcVar11 == (char **)0x0) goto LAB_0011c3e3;
              (local_290->Set).elements = ppcVar11;
LAB_0011c1df:
              pcVar9 = strdup(glob_00->glob_buffer);
              lVar2 = (local_248->content).Set.size;
              ppcVar11[lVar2] = pcVar9;
              if (pcVar9 == (char *)0x0) goto LAB_0011c3e3;
              (local_248->content).Set.size = lVar2 + 1;
              paVar19 = local_290;
              pUVar21 = local_248;
              if (pbVar22[lVar10] != 0x7d) goto LAB_0011c250;
              lVar10 = lVar10 + 1;
            } while( true );
          }
        }
        else {
          *pbVar18 = 0;
          pcVar9 = glob_00->glob_buffer;
          sVar1 = glob_00->size;
          glob_00->pattern[sVar1].type = UPTSet;
          glob_00->pattern[sVar1].globindex = -1;
          glob_00->pattern[sVar1].content.Set.size = 1;
          glob_00->pattern[sVar1].content.Set.ptr_s = 0;
          ppcVar11 = (char **)malloc(8);
          glob_00->pattern[sVar1].content.Set.elements = ppcVar11;
          if (ppcVar11 != (char **)0x0) {
            __dest = (char *)malloc(sVar8 + 1);
            *ppcVar11 = __dest;
            if (__dest != (char *)0x0) {
              memcpy(__dest,pcVar9,sVar8);
              __dest[sVar8] = '\0';
LAB_0011c098:
              CVar23 = CURLE_OK;
              goto LAB_0011c61b;
            }
          }
          glob_00->error = "out of memory";
          glob_00->pos = 0;
          CVar23 = CURLE_OUT_OF_MEMORY;
        }
LAB_0011c61b:
        uVar15 = glob_00->size + 1;
        glob_00->size = uVar15;
      } while (uVar15 < 100);
      pcVar9 = "too many globs";
LAB_0011c82a:
      glob_00->error = pcVar9;
      glob_00->pos = (size_t)local_2b8;
      CVar23 = CURLE_URL_MALFORMAT;
LAB_0011c841:
      pFVar3 = local_268;
      if ((local_268 != (FILE *)0x0) &&
         (ppcVar11 = (char **)glob_00->error, ppcVar11 != (char **)0x0)) {
        sVar1 = glob_00->pos;
        if (sVar1 != 0) {
          curl_msnprintf(&endp,0x200,"%s in URL position %zu:\n%s\n%*s^",ppcVar11,sVar1,local_258,
                         (int)sVar1 + -1," ");
          ppcVar11 = &endp;
        }
        curl_mfprintf(pFVar3,"curl: (%d) %s\n",CVar23,ppcVar11);
      }
      glob_cleanup(glob_00);
      *local_260 = 1;
      return CVar23;
    }
    free(pcVar9);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_0011c250:
  local_278 = (byte *)glob_00->glob_buffer;
LAB_0011c295:
  local_270 = lVar10 + 1;
  local_250 = local_2a0;
  goto LAB_0011c125;
}

Assistant:

CURLcode glob_url(struct URLGlob **glob, char *url, curl_off_t *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  struct URLGlob *glob_expand;
  curl_off_t amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0] = 0;

  glob_expand = calloc(1, sizeof(struct URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[512];
      const char *t;
      if(glob_expand->pos) {
        msnprintf(text, sizeof(text), "%s in URL position %zu:\n%s\n%*s^",
                  glob_expand->error,
                  glob_expand->pos, url, (int)glob_expand->pos - 1, " ");
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}